

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ClusterList.h
# Opt level: O0

void __thiscall
SegmentClusterList<unsigned_int,_Memory::JitArenaAllocator,_16U>::Merge
          (SegmentClusterList<unsigned_int,_Memory::JitArenaAllocator,_16U> *this,uint a,uint b)

{
  uint index;
  uint index_00;
  uint local_34;
  uint min;
  uint bVal;
  uint aVal;
  uint b_local;
  uint a_local;
  SegmentClusterList<unsigned_int,_Memory::JitArenaAllocator,_16U> *this_local;
  
  if (a != b) {
    index = SegmentClusterList<unsigned_int,Memory::JitArenaAllocator,16u>::Lookup<true,false>
                      ((SegmentClusterList<unsigned_int,Memory::JitArenaAllocator,16u> *)this,a);
    index_00 = SegmentClusterList<unsigned_int,Memory::JitArenaAllocator,16u>::Lookup<true,false>
                         ((SegmentClusterList<unsigned_int,Memory::JitArenaAllocator,16u> *)this,b);
    local_34 = index_00;
    if (index < index_00) {
      local_34 = index;
    }
    Assign<false>(this,index,local_34);
    Assign<false>(this,index_00,local_34);
    if ((index != local_34) || (index_00 != local_34)) {
      this->consolidated = false;
    }
  }
  return;
}

Assistant:

void Merge(indexType a, indexType b)
    {
        if (a == b)
            return;
        indexType aVal = Lookup<true>(a);
        indexType bVal = Lookup<true>(b);
        indexType min = (aVal < bVal ? aVal : bVal);
        // We need to update the roots of both branches to point to the min
        Assign<false>(aVal, min);
        Assign<false>(bVal, min);
#if DBG
        if(aVal != min || bVal != min)
            consolidated = false;
#endif
    }